

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

utf8_size_t utf8_char_count(char *data,size_t size)

{
  utf8_size_t uVar1;
  ulong uVar2;
  long lVar3;
  
  if (size == 0) {
    size = strlen(data);
  }
  uVar1 = 0;
  if (size != 0) {
    uVar2 = 0;
    do {
      if ((data == (char *)0x0) || (data[uVar2] == 0)) {
        lVar3 = 0;
      }
      else {
        lVar3 = *(long *)((long)utf8_char_length::_utf8_char_length +
                         (ulong)((byte)data[uVar2] & 0xfffffff8));
      }
      if (lVar3 == 0) {
        return uVar1;
      }
      uVar1 = uVar1 + 1;
      uVar2 = uVar2 + lVar3;
    } while (uVar2 < size);
  }
  return uVar1;
}

Assistant:

utf8_size_t utf8_char_count(const char* data, size_t size)
{
    size_t i, bytes = 0;
    utf8_size_t count = 0;

    if (0 == size) {
        size = strlen(data);
    }

    for (i = 0; i < size; ++count, i += bytes) {
        if (0 == (bytes = utf8_char_length(&data[i]))) {
            break;
        }
    }

    return count;
}